

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DarknetUtility.cpp
# Opt level: O2

void __thiscall
DarknetUtility::drawPred
          (DarknetUtility *this,int classId,float conf,int left,int top,int right,int bottom,
          Mat *frame)

{
  pointer pbVar1;
  pointer pbVar2;
  undefined8 uVar3;
  int baseLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  Size labelSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string label;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  Scalar_<double> local_50;
  
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8._M_dataplus._M_p._0_4_ = 0x3010000;
  local_e8._M_string_length = (size_type)frame;
  local_60 = right;
  local_5c = bottom;
  local_58 = left;
  local_54 = top;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&label);
  label._M_dataplus._M_p._0_4_ = 0;
  label._M_dataplus._M_p._4_4_ = 0;
  label._M_string_length._0_4_ = 0;
  label._M_string_length._4_4_ = 0x406fe000;
  label.field_2._M_allocated_capacity = 0;
  label.field_2._8_8_ = 0;
  cv::rectangle(&local_e8,&local_58,&local_60,&label,1,8,0);
  cv::format_abi_cxx11_((char *)&label,SUB84((double)conf,0),"%.2f");
  pbVar1 = (this->classes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->classes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    if ((int)((ulong)((long)pbVar2 - (long)pbVar1) >> 5) <= classId) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"classId < (int)classes.size()",(allocator<char> *)&local_a8);
      uVar3 = cv::error(-0xd7,(string *)&local_e8,"drawPred",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DimasVeliz[P]OpenCvDnnPythonAndBasicCpp/darknetUtility/src/DarknetUtility.cpp"
                        ,0x54);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&label);
      _Unwind_Resume(uVar3);
    }
    std::operator+(&local_a8,pbVar1 + classId,": ");
    std::operator+(&local_e8,&local_a8,&label);
    std::__cxx11::string::operator=((string *)&label,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  cv::getTextSize((string *)&labelSize,(int)&label,0.5,0,(int *)0x1);
  if (top < labelSize.height) {
    top = labelSize.height;
  }
  local_a8.field_2._M_allocated_capacity = 0;
  local_a8._M_dataplus._M_p._0_4_ = 0x3010000;
  local_a8._M_string_length = (size_type)frame;
  local_b4 = top - labelSize.height;
  local_c0 = labelSize.width + left;
  local_bc = baseLine + top;
  local_b8 = left;
  cv::Scalar_<double>::all((Scalar_<double> *)&local_e8,255.0);
  cv::rectangle(&local_a8,&local_b8,&local_c0,&local_e8,0xffffffffffffffff,8,0);
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8._M_dataplus._M_p._0_4_ = 0x3010000;
  local_e8._M_string_length = (size_type)frame;
  local_c8 = left;
  local_c4 = top;
  cv::Scalar_<double>::Scalar_(&local_50);
  cv::putText(0,&local_e8,&label,&local_c8,0,&local_50,1,8,0);
  std::__cxx11::string::~string((string *)&label);
  return;
}

Assistant:

void DarknetUtility::drawPred(int classId, float conf, int left, int top, int right, int bottom, Mat &frame)
{
    rectangle(frame, Point(left, top), Point(right, bottom), Scalar(0, 255, 0));
    std::string label = format("%.2f", conf);

    if (!classes.empty())
    {
        CV_Assert(classId < (int)classes.size());
        label = classes[classId] + ": " + label;
    }
    int baseLine;
    Size labelSize = getTextSize(label, FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);
    top = max(top, labelSize.height);
    rectangle(frame, Point(left, top - labelSize.height),
              Point(left + labelSize.width, top + baseLine), Scalar::all(255), FILLED);
    putText(frame, label, Point(left, top), FONT_HERSHEY_SIMPLEX, 0.5, Scalar());
}